

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<int,_false,_std::allocator<unsigned_long>_> *from,
              View<int,_false,_std::allocator<unsigned_long>_> *to)

{
  CoordinateOrder CVar1;
  int iVar2;
  view_pointer pVVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  runtime_error *this;
  reference piVar7;
  reference piVar8;
  int *piVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  reference piVar12;
  reference piVar13;
  reference piVar14;
  reference piVar15;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar16;
  Marray<int,_std::allocator<unsigned_long>_> m;
  ToIterator itTo;
  undefined1 local_a8 [16];
  unsigned_long *local_98;
  unsigned_long *local_90;
  unsigned_long *local_88;
  pointer local_80;
  size_t sStack_78;
  CoordinateOrder local_70;
  bool local_6c;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_60;
  
  if (from != to) {
    if (to->data_ != (pointer)0x0) {
      if ((from->data_ == (pointer)0x0) ||
         ((from->geometry_).dimension_ != (to->geometry_).dimension_)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Assertion failed.");
      }
      else {
        uVar16 = 0;
        do {
          if ((from->geometry_).dimension_ <= uVar16) {
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            piVar12 = from->data_;
            if ((piVar12 != (reference)0x0) && (piVar13 = to->data_, piVar13 != (reference)0x0)) {
              piVar7 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                 (from,(from->geometry_).size_ - 1);
              piVar8 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                 (to,(to->geometry_).size_ - 1);
              if (((piVar12 <= piVar13) && (piVar13 <= piVar7)) ||
                 ((piVar13 <= piVar12 && (piVar12 <= piVar8)))) {
                Marray<int,std::allocator<unsigned_long>>::
                Marray<int,false,std::allocator<unsigned_long>>
                          ((Marray<int,std::allocator<unsigned_long>> *)local_a8,from);
                execute((View<int,_false,_std::allocator<unsigned_long>_> *)local_a8,to);
                operator_delete((void *)local_a8._0_8_,sStack_78 << 2);
                goto LAB_0021a01a;
              }
            }
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
            CVar1 = (from->geometry_).coordinateOrder_;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            if (((CVar1 == (to->geometry_).coordinateOrder_) &&
                (View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(from),
                (from->geometry_).isSimple_ == true)) &&
               (View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to),
               (to->geometry_).isSimple_ == true)) {
              memcpy(to->data_,from->data_,(from->geometry_).size_ << 2);
              return;
            }
            pVVar3 = (view_pointer)from->data_;
            if (pVVar3 == (view_pointer)0x0) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"Assertion failed.");
              goto LAB_0021a0f4;
            }
            switch((from->geometry_).dimension_) {
            case 1:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),3,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              sStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              piVar12 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              piVar9 = AccessOperatorHelper<true>::
                       execute<int,int,false,std::allocator<unsigned_long>>(from,(int *)&local_60);
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
              if (sVar5 != 0) {
                uVar16 = 0;
                do {
                  *piVar12 = *piVar9;
                  sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(to,0);
                  sVar6 = View<int,_true,_std::allocator<unsigned_long>_>::strides
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
                  sVar10 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
                  piVar12 = piVar12 + sVar5;
                  uVar16 = uVar16 + 1;
                  piVar9 = piVar9 + sVar6;
                } while (uVar16 < sVar10);
              }
              View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
              View<int,_false,_std::allocator<unsigned_long>_>::strides(to,0);
              View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
              View<int,_true,_std::allocator<unsigned_long>_>::strides
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
LAB_0021a01a:
              uVar16 = (long)local_80 * 0x18;
              puVar11 = local_98;
              break;
            case 2:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),6,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              sStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              piVar12 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              piVar13 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,piVar12,piVar13);
              goto LAB_0021a01a;
            case 3:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),9,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              sStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              piVar12 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              piVar13 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,piVar12,piVar13);
              goto LAB_0021a01a;
            case 4:
              View<int,_true,_std::allocator<unsigned_long>_>::View
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
              local_60.view_._0_4_ = 0;
              piVar12 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              piVar13 = AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,piVar12,piVar13);
              goto LAB_0021a01a;
            default:
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 5) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 6) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 7) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 8) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 9) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 10) {
                View<int,_true,_std::allocator<unsigned_long>_>::View
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from);
                local_60.view_._0_4_ = 0;
                piVar12 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                piVar13 = AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,piVar12,piVar13);
                goto LAB_0021a01a;
              }
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
              Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a8,from,0);
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
              Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_60,to,0);
              while (bVar4 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                        local_a8), bVar4) {
                piVar14 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                                    );
                iVar2 = *piVar14;
                piVar15 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_60)
                ;
                *piVar15 = iVar2;
                Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_60);
              }
              if (local_60.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_90 == (unsigned_long *)0x0) {
                return;
              }
              uVar16 = (long)local_80 - (long)local_90;
              puVar11 = local_90;
            }
            operator_delete(puVar11,uVar16);
            return;
          }
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(from,uVar16);
          sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,uVar16);
          if (sVar5 != sVar6) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_0021a0f4;
          }
          uVar16 = uVar16 + 1;
        } while (from->data_ != (pointer)0x0);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Assertion failed.");
      }
LAB_0021a0f4:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    to->data_ = from->data_;
    sVar5 = (from->geometry_).dimension_;
    puVar11 = (to->geometry_).shape_;
    sVar6 = (to->geometry_).dimension_;
    if (sVar5 != sVar6) {
      operator_delete(puVar11,sVar6 * 0x18);
      sVar5 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar5;
      puVar11 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                          ((new_allocator<unsigned_long> *)&to->geometry_,sVar5 * 3,(void *)0x0);
      (to->geometry_).shape_ = puVar11;
      sVar5 = (to->geometry_).dimension_;
      (to->geometry_).shapeStrides_ = puVar11 + sVar5;
      (to->geometry_).strides_ = puVar11 + sVar5 + sVar5;
      sVar5 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar5;
    }
    memcpy(puVar11,(from->geometry_).shape_,sVar5 * 0x18);
    (to->geometry_).size_ = (from->geometry_).size_;
    (to->geometry_).coordinateOrder_ = (from->geometry_).coordinateOrder_;
    (to->geometry_).isSimple_ = (from->geometry_).isSimple_;
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, false, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, false, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(static_cast<const void*>(&from) != static_cast<const void*>(&to)) { // no self-assignment
            if(to.data_ == 0) { // if the view 'to' is not initialized
                // initialize the view 'to' with source data
                Assert(MARRAY_NO_ARG_TEST || sizeof(TTo) == sizeof(TFrom));
                to.data_ = static_cast<TTo*>(static_cast<void*>(from.data_)); // copy pointer
                to.geometry_ = from.geometry_;
            }
            else { // if the view 'to' is initialized
                if(!MARRAY_NO_ARG_TEST) {
                    Assert(from.data_ != 0 && from.dimension() == to.dimension());
                    for(std::size_t j=0; j<from.dimension(); ++j) {
                        Assert(from.shape(j) == to.shape(j));
                    }
                }
                if(from.overlaps(to)) {
                    Marray<TFrom, AFrom> m = from; // temporary copy
                    execute(m, to);
                }
                else if(from.coordinateOrder() == to.coordinateOrder() 
                        && from.isSimple() && to.isSimple()
                        && IsEqual<TFrom, TTo>::type) {
                    memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
                }
                else if(from.dimension() == 1)
                    OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 2)
                    OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 3)
                    OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 4)
                    OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 5)
                    OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 6)
                    OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 7)
                    OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 8)
                    OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 9)
                    OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 10)
                    OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else {
                    FromIterator itFrom = from.begin();
                    ToIterator itTo = to.begin();
                    for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                        *itTo = static_cast<TTo>(*itFrom);
                    }
                }
            }
        }
    }